

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void havingToWhere(Parse *pParse,Select *p)

{
  undefined1 local_48 [8];
  Walker sWalker;
  Select *p_local;
  Parse *pParse_local;
  
  sWalker.u.pSelect = p;
  memset(local_48,0,0x30);
  sWalker.pParse = (Parse *)havingToWhereExprCb;
  sWalker._32_8_ = sWalker.u;
  local_48 = (undefined1  [8])pParse;
  sqlite3WalkExpr((Walker *)local_48,(sWalker.u.pSelect)->pHaving);
  return;
}

Assistant:

static void havingToWhere(Parse *pParse, Select *p){
  Walker sWalker;
  memset(&sWalker, 0, sizeof(sWalker));
  sWalker.pParse = pParse;
  sWalker.xExprCallback = havingToWhereExprCb;
  sWalker.u.pSelect = p;
  sqlite3WalkExpr(&sWalker, p->pHaving);
#if SELECTTRACE_ENABLED
  if( sWalker.eCode && (sqlite3SelectTrace & 0x100)!=0 ){
    SELECTTRACE(0x100,pParse,p,("Move HAVING terms into WHERE:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif
}